

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

error_code __thiscall
slang::SourceManager::addSystemDirectories(SourceManager *this,string_view pattern)

{
  const_iterator __position;
  error_code eVar1;
  string_view pattern_00;
  error_code *in_stack_ffffffffffffff30;
  error_code ec;
  unique_lock<std::shared_mutex> lock;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  
  pattern_00._M_len = pattern._M_str;
  dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path((path *)&lock);
  pattern_00._M_str = (char *)0x1;
  svGlob((slang *)&lock,(path *)pattern._M_len,pattern_00,(GlobMode)&dirs,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(&ec,0),
         in_stack_ffffffffffffff30);
  std::filesystem::__cxx11::path::~path((path *)&lock);
  std::unique_lock<std::shared_mutex>::unique_lock(&lock,&this->includeDirMutex);
  __position._M_current =
       (this->systemDirectories).
       super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
  insert<std::filesystem::__cxx11::path*,void>
            ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)&this->systemDirectories,__position,
             dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_,
             dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
             dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
  std::unique_lock<std::shared_mutex>::~unique_lock(&lock);
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&dirs.super_SmallVectorBase<std::filesystem::__cxx11::path>,
             (EVP_PKEY_CTX *)__position._M_current);
  eVar1._4_4_ = 0;
  eVar1._M_value = ec._M_value;
  eVar1._M_cat = ec._M_cat;
  return eVar1;
}

Assistant:

std::error_code SourceManager::addSystemDirectories(std::string_view pattern) {
    SmallVector<fs::path> dirs;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, dirs, /* expandEnvVars */ false, ec);

    // Note: locking the separate mutex for include dirs here.
    std::unique_lock<std::shared_mutex> lock(includeDirMutex);
    systemDirectories.insert(systemDirectories.end(), dirs.begin(), dirs.end());
    return ec;
}